

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

void bury_objs(int x,int y)

{
  obj *otmp;
  
  for (otmp = level->objects[x][y]; otmp != (obj *)0x0; otmp = bury_an_obj(otmp)) {
  }
  del_engr_at(level,x,y);
  newsym(x,y);
  return;
}

Assistant:

void bury_objs(int x, int y)
{
	struct obj *otmp, *otmp2;

	for (otmp = level->objects[x][y]; otmp; otmp = otmp2)
		otmp2 = bury_an_obj(otmp);

	/* don't expect any engravings here, but just in case */
	del_engr_at(level, x, y);
	newsym(x, y);
}